

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

reverse_iterator * __thiscall llvm::sys::path::reverse_iterator::operator++(reverse_iterator *this)

{
  size_t sVar1;
  char cVar2;
  size_t sVar3;
  Style style;
  undefined8 in_RCX;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  bool bVar9;
  StringRef str;
  StringRef str_00;
  undefined8 uVar4;
  ulong uVar8;
  
  str.Length._0_4_ = this->S;
  str.Data = (char *)(this->Path).Length;
  str.Length._4_4_ = 0;
  sVar3 = anon_unknown.dwarf_3cc2557::root_dir_start
                    ((anon_unknown_dwarf_3cc2557 *)(this->Path).Data,str,(Style)in_RCX);
  sVar7 = this->Position;
  do {
    uVar8 = sVar7;
    sVar7 = uVar8 - 1;
    if ((sVar7 == 0xffffffffffffffff) || (sVar3 == sVar7)) break;
    cVar2 = StringRef::operator[](&this->Path,sVar7);
  } while ((cVar2 == '/') || ((cVar2 == '\\' && (this->S == windows))));
  sVar1 = (this->Path).Length;
  bVar9 = this->Position != sVar1;
  uVar4 = CONCAT71((int7)((ulong)in_RCX >> 8),bVar9);
  style = (Style)uVar4;
  if (sVar1 != 0 && !bVar9) {
    cVar2 = StringRef::back(&this->Path);
    style = (Style)uVar4;
    if (((cVar2 == '/') || ((cVar2 == '\\' && (this->S == windows)))) &&
       (style = (Style)CONCAT71((int7)((ulong)uVar4 >> 8),sVar7 <= sVar3),
       sVar3 == 0xffffffffffffffff || sVar7 > sVar3)) {
      this->Position = this->Position - 1;
      (this->Component).Data = ".";
      (this->Component).Length = 1;
      return this;
    }
  }
  uVar5 = (this->Path).Length;
  if (uVar8 <= uVar5) {
    uVar5 = uVar8;
  }
  str_00.Length._0_4_ = this->S;
  str_00.Data = (char *)uVar5;
  str_00.Length._4_4_ = 0;
  sVar3 = anon_unknown.dwarf_3cc2557::filename_pos
                    ((anon_unknown_dwarf_3cc2557 *)(this->Path).Data,str_00,style);
  uVar5 = (this->Path).Length;
  sVar7 = sVar3;
  if (uVar5 < sVar3) {
    sVar7 = uVar5;
  }
  uVar6 = uVar8;
  if (uVar8 < sVar7) {
    uVar6 = sVar7;
  }
  if (uVar5 < uVar8) {
    uVar6 = uVar5;
  }
  (this->Component).Data = (this->Path).Data + sVar7;
  (this->Component).Length = uVar6 - sVar7;
  this->Position = sVar3;
  return this;
}

Assistant:

reverse_iterator &reverse_iterator::operator++() {
  size_t root_dir_pos = root_dir_start(Path, S);

  // Skip separators unless it's the root directory.
  size_t end_pos = Position;
  while (end_pos > 0 && (end_pos - 1) != root_dir_pos &&
         is_separator(Path[end_pos - 1], S))
    --end_pos;

  // Treat trailing '/' as a '.', unless it is the root dir.
  if (Position == Path.size() && !Path.empty() &&
      is_separator(Path.back(), S) &&
      (root_dir_pos == StringRef::npos || end_pos - 1 > root_dir_pos)) {
    --Position;
    Component = ".";
    return *this;
  }

  // Find next separator.
  size_t start_pos = filename_pos(Path.substr(0, end_pos), S);
  Component = Path.slice(start_pos, end_pos);
  Position = start_pos;
  return *this;
}